

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O3

void ImNodes::EndSlot(void)

{
  Pair **ppPVar1;
  float val;
  ImGuiStorage *this;
  ImGuiWindow *window;
  long lVar2;
  ImGuiStorage *pIVar3;
  Pair *pPVar4;
  Pair *pPVar5;
  long lVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  Pair **ppPVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  ImGuiID IVar13;
  ImU32 IVar14;
  int iVar15;
  ImGuiPayload *pIVar16;
  ImGuiStorage *pIVar17;
  Pair **ppPVar18;
  ImRect *pIVar19;
  char drag_id [32];
  ImRect slot_rect;
  float local_88;
  float fStack_84;
  char local_78 [40];
  undefined1 local_50 [12];
  float fStack_44;
  ImVec2 local_40;
  undefined8 local_38;
  ulong local_30;
  
  ImGui::GetStyle();
  lVar6 = gCanvas;
  this = *(ImGuiStorage **)(gCanvas + 0x98);
  ImGui::EndGroup();
  ppPVar9 = (Pair **)(this + 3);
  ImGui::PushID(*(char **)&this[3].Data);
  ImGui::PushID(*(int *)&this[2].Data.Data);
  IVar7 = ImGui::GetItemRectMin();
  IVar8 = ImGui::GetItemRectMax();
  local_88 = IVar7.x;
  fStack_84 = IVar7.y;
  local_50._8_4_ = IVar8.x;
  fStack_44 = IVar8.y;
  local_50._0_4_ = local_88;
  local_50._4_4_ = fStack_84;
  IVar13 = ImGui::GetID(*(char **)&this[3].Data);
  ImGui::ItemAdd((ImRect *)local_50,IVar13,(ImRect *)0x0);
  bVar12 = ImGui::IsMouseClicked(0,false);
  if ((bVar12) && (bVar12 = ImGui::IsItemHovered(0), bVar12)) {
    IVar13 = ImGui::GetID((char *)*ppPVar9);
    window = GImGui->CurrentWindow;
    window->WriteAccessed = true;
    ImGui::SetActiveID(IVar13,window);
  }
  bVar12 = ImGui::IsItemActive();
  if ((bVar12) && (bVar12 = ImGui::IsMouseDown(0), !bVar12)) {
    ImGui::ClearActiveID();
  }
  iVar15 = *(int *)&this[2].Data.Data;
  pIVar19 = (ImRect *)local_50;
  if (-1 < iVar15) {
    pIVar19 = (ImRect *)(local_50 + 8);
  }
  val = (pIVar19->Min).x;
  IVar14 = MakeSlotDataID("x",*(char **)&this[3].Data,*(void **)&this[1].Data,
                          SUB41((uint)iVar15 >> 0x1f,0));
  ImGuiStorage::SetFloat(this,IVar14,val);
  IVar14 = MakeSlotDataID("y",*(char **)&this[3].Data,*(void **)&this[1].Data,
                          SUB41((uint)*(undefined4 *)&this[2].Data.Data >> 0x1f,0));
  ImGuiStorage::SetFloat(this,IVar14,(fStack_44 - (float)local_50._4_4_) * -0.5 + fStack_44);
  bVar12 = ImGui::BeginDragDropSource(0);
  if (bVar12) {
    pIVar16 = ImGui::GetDragDropPayload();
    snprintf(local_78,0x20,"new-node-connection-%08X");
    if (((pIVar16 == (ImGuiPayload *)0x0) || (pIVar16->DataFrameCount == -1)) ||
       (iVar15 = strcmp(local_78,pIVar16->DataType), iVar15 != 0)) {
      local_40 = *(ImVec2 *)(this + 1);
      local_30 = (ulong)*(uint *)&this[2].Data.Data;
      local_38._0_4_ = this[3].Data.Size;
      local_38._4_4_ = this[3].Data.Capacity;
      ImGui::SetDragDropPayload(local_78,&local_40,0x18,0);
      this[4].Data.Size = 0;
      this[4].Data.Capacity = 0;
      this[4].Data.Data = (Pair *)0x0;
      this[5].Data.Size = 0;
      this[5].Data.Capacity = 0;
      this[5].Data.Data = (Pair *)0x0;
      lVar2 = *(long *)(lVar6 + 0x98);
      if (*(void **)(lVar2 + 0xa0) != (void *)0x0) {
        *(undefined8 *)(lVar2 + 0x98) = 0;
        ImGui::MemFree(*(void **)(lVar2 + 0xa0));
        *(undefined8 *)(lVar2 + 0xa0) = 0;
      }
    }
    ImGui::TextUnformatted((char *)*ppPVar9,(char *)0x0);
    ImGui::EndDragDropSource();
  }
  bVar12 = IsConnectingCompatibleSlot();
  if ((bVar12) && (bVar12 = ImGui::BeginDragDropTarget(), bVar12)) {
    snprintf(local_78,0x20,"new-node-connection-%08X",(ulong)(uint)-*(int *)&this[2].Data.Data);
    pIVar16 = ImGui::AcceptDragDropPayload(local_78,0);
    if (pIVar16 != (ImGuiPayload *)0x0) {
      bVar12 = *(int *)&this[2].Data.Data < 0;
      pIVar3 = (ImGuiStorage *)pIVar16->Data;
      pIVar17 = pIVar3;
      if (bVar12) {
        pIVar17 = this + 1;
      }
      ppPVar1 = &(pIVar3->Data).Data;
      ppPVar18 = ppPVar1;
      if (!bVar12) {
        ppPVar18 = ppPVar9;
        ppPVar9 = ppPVar1;
        pIVar3 = this + 1;
      }
      pPVar4 = *ppPVar18;
      iVar10 = (pIVar3->Data).Size;
      iVar11 = (pIVar3->Data).Capacity;
      pPVar5 = *ppPVar9;
      iVar15 = (pIVar17->Data).Capacity;
      this[4].Data.Size = (pIVar17->Data).Size;
      this[4].Data.Capacity = iVar15;
      this[4].Data.Data = pPVar5;
      this[5].Data.Size = iVar10;
      this[5].Data.Capacity = iVar11;
      this[5].Data.Data = pPVar4;
      *(undefined1 *)&this[8].Data.Data = 1;
      lVar6 = *(long *)(lVar6 + 0x98);
      if (*(void **)(lVar6 + 0xa0) != (void *)0x0) {
        *(undefined8 *)(lVar6 + 0x98) = 0;
        ImGui::MemFree(*(void **)(lVar6 + 0xa0));
        *(undefined8 *)(lVar6 + 0xa0) = 0;
      }
    }
    ImGui::EndDragDropTarget();
  }
  ImGui::PopID();
  ImGui::PopID();
  return;
}

Assistant:

void EndSlot()
{
    const ImGuiStyle& style = ImGui::GetStyle();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;

    ImGui::EndGroup();

    ImGui::PushID(impl->slot.title);
    ImGui::PushID(impl->slot.kind);

    ImRect slot_rect{ImGui::GetItemRectMin(), ImGui::GetItemRectMax()};
    // This here adds extra line between slots because after user renders slot cursor is already past those items.
    // ImGui::ItemSize(slot_rect.GetSize());
    ImGui::ItemAdd(slot_rect, ImGui::GetID(impl->slot.title));

    if (ImGui::IsMouseClicked(0) && ImGui::IsItemHovered())
        ImGui::SetActiveID(ImGui::GetID(impl->slot.title), ImGui::GetCurrentWindow());

    if (ImGui::IsItemActive() && !ImGui::IsMouseDown(0))
        ImGui::ClearActiveID();

    // Store slot edge positions, curves will connect there
    {
        float x;
        if (IsInputSlotKind(impl->slot.kind))
            x = slot_rect.Min.x;
        else
            x = slot_rect.Max.x;

        impl->cached_data.SetFloat(MakeSlotDataID("x", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)), x);
        impl->cached_data.SetFloat(MakeSlotDataID("y", impl->slot.title, impl->node.id, IsInputSlotKind(impl->slot.kind)),
            slot_rect.Max.y - slot_rect.GetHeight() / 2);
    }

    if (ImGui::BeginDragDropSource())
    {
        auto* payload = ImGui::GetDragDropPayload();
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind);
        if (payload == nullptr || !payload->IsDataType(drag_id))
        {
            _DragConnectionPayload drag_data{ };
            drag_data.node_id = impl->node.id;
            drag_data.slot_kind = impl->slot.kind;
            drag_data.slot_title = impl->slot.title;

            ImGui::SetDragDropPayload(drag_id, &drag_data, sizeof(drag_data));

            // Clear new connection info
            impl->new_connection.input_node = nullptr;
            impl->new_connection.input_slot = nullptr;
            impl->new_connection.output_node = nullptr;
            impl->new_connection.output_slot = nullptr;
            canvas->_impl->ignore_connections.clear();
        }
        ImGui::TextUnformatted(impl->slot.title);
        ImGui::EndDragDropSource();
    }

    if (IsConnectingCompatibleSlot() && ImGui::BeginDragDropTarget())
    {
        // Accept drags from opposite type (input <-> output, and same kind)
        char drag_id[32];
        snprintf(drag_id, sizeof(drag_id), "new-node-connection-%08X", impl->slot.kind * -1);

        if (auto* payload = ImGui::AcceptDragDropPayload(drag_id))
        {
            auto* drag_data = (_DragConnectionPayload*) payload->Data;

            // Store info of source slot to be queried by ImNodes::GetConnection()
            if (!IsInputSlotKind(impl->slot.kind))
            {
                impl->new_connection.input_node = drag_data->node_id;
                impl->new_connection.input_slot = drag_data->slot_title;
                impl->new_connection.output_node = impl->node.id;
                impl->new_connection.output_slot = impl->slot.title;
            }
            else
            {
                impl->new_connection.input_node = impl->node.id;
                impl->new_connection.input_slot = impl->slot.title;
                impl->new_connection.output_node = drag_data->node_id;
                impl->new_connection.output_slot = drag_data->slot_title;
            }
            impl->just_connected = true;
            canvas->_impl->ignore_connections.clear();
        }

        ImGui::EndDragDropTarget();
    }

    ImGui::PopID(); // kind
    ImGui::PopID(); // name
}